

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O0

void __thiscall
sqlcheck::TestSuite_MultiValuedAttributeTest_Test::~TestSuite_MultiValuedAttributeTest_Test
          (TestSuite_MultiValuedAttributeTest_Test *this)

{
  TestSuite_MultiValuedAttributeTest_Test *this_local;
  
  ~TestSuite_MultiValuedAttributeTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(TestSuite, MultiValuedAttributeTest) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(
      "SELECT product_id FROM Products WHERE account_id REGEXP '[[:<:]]12[[:>:]]';\n"

      "CREATE TABLE Products ("
      "product_id   SERIAL PRIMARY KEY,"
      "product_name VARCHAR(1000),"
      "account_id   VARCHAR(100));\n"

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}